

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::MergeIfVisitor::transform_block(StmtBlock *block)

{
  pointer *this;
  __node_base_ptr *this_00;
  IfStmt *this_01;
  element_type *peVar1;
  shared_ptr<kratos::Stmt> *psVar2;
  __node_base_ptr this_02;
  bool bVar3;
  iterator iVar4;
  mapped_type *ppIVar5;
  iterator iVar6;
  _Base_ptr p_Var7;
  long lVar8;
  __shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *__r;
  type *stmt;
  undefined1 auVar9 [8];
  ulong uVar10;
  shared_ptr<kratos::Stmt> *st;
  shared_ptr<kratos::Stmt> *psVar11;
  undefined8 *puVar12;
  undefined1 local_128 [8];
  map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
  result;
  unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
  merged_if;
  unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
  mapping;
  shared_ptr<kratos::IfStmt> top_if;
  undefined1 local_60 [8];
  vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
  stmts;
  int64_t const_value;
  element_type *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,"merge_if_block",
             (allocator<char> *)&merged_if._M_h._M_single_bucket);
  bVar3 = IRNode::has_attribute
                    ((IRNode *)block,
                     (string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar3) {
    result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&result;
    result._M_t._M_impl._0_4_ = 0;
    result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    result._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    result._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    get_targeted_if(block,(map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                           *)local_128);
    result._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&merged_if._M_h._M_rehash_policy._M_next_resize;
    merged_if._M_h._M_buckets = (__buckets_ptr)0x1;
    merged_if._M_h._M_bucket_count = 0;
    merged_if._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    merged_if._M_h._M_element_count._0_4_ = 0x3f800000;
    merged_if._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    merged_if._M_h._M_rehash_policy._4_4_ = 0;
    merged_if._M_h._M_rehash_policy._M_next_resize = 0;
    this = &stmts.
            super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (p_Var7 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 != (_Rb_tree_node_base *)&result; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)
        ) {
      std::
      vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
      ::vector((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                *)local_60,
               (vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                *)&p_Var7[1]._M_parent);
      if (0x20 < (ulong)((long)stmts.
                               super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)local_60)) {
        std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                   &mapping._M_h._M_single_bucket,
                   (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)local_60);
        merged_if._M_h._M_single_bucket =
             (__node_base_ptr)&mapping._M_h._M_rehash_policy._M_next_resize;
        mapping._M_h._M_buckets = (__buckets_ptr)0x1;
        mapping._M_h._M_bucket_count = 0;
        mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        mapping._M_h._M_element_count._0_4_ = 0x3f800000;
        mapping._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        mapping._M_h._M_rehash_policy._4_4_ = 0;
        mapping._M_h._M_rehash_policy._M_next_resize = 0;
        top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             stmts.
             super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        for (auVar9 = local_60;
            auVar9 != (undefined1  [8])
                      top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi; auVar9 = (undefined1  [8])((long)auVar9 + 0x20)) {
          stmts.
          super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((((pointer)auVar9)->second).
                         super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        value_;
          iVar4 = std::
                  _Hashtable<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)&merged_if._M_h._M_single_bucket,(key_type_conflict1 *)this);
          if (iVar4.super__Node_iterator_base<std::pair<const_long,_kratos::IfStmt_*>,_false>._M_cur
              == (__node_type *)0x0) {
            local_38 = (((pointer)auVar9)->first).
                       super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::
            _Hashtable<long,std::pair<long_const,kratos::IfStmt*>,std::allocator<std::pair<long_const,kratos::IfStmt*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<long&,kratos::IfStmt*>
                      ((_Hashtable<long,std::pair<long_const,kratos::IfStmt*>,std::allocator<std::pair<long_const,kratos::IfStmt*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&merged_if._M_h._M_single_bucket,this,&local_38);
          }
          else {
            ppIVar5 = std::__detail::
                      _Map_base<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&merged_if._M_h._M_single_bucket,(key_type *)this);
            this_01 = *ppIVar5;
            peVar1 = (((((pointer)auVar9)->first).
                       super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     then_body_).
                     super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            psVar2 = (peVar1->super_StmtBlock).stmts_.
                     super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (psVar11 = *(shared_ptr<kratos::Stmt> **)
                            &(peVar1->super_StmtBlock).stmts_.
                             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                             ._M_impl; psVar11 != psVar2; psVar11 = psVar11 + 1) {
              IfStmt::add_then_stmt(this_01,psVar11);
            }
            peVar1 = (((((pointer)auVar9)->first).
                       super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     else_body_).
                     super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            psVar2 = (peVar1->super_StmtBlock).stmts_.
                     super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (psVar11 = *(shared_ptr<kratos::Stmt> **)
                            &(peVar1->super_StmtBlock).stmts_.
                             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                             ._M_impl; psVar11 != psVar2; psVar11 = psVar11 + 1) {
              IfStmt::add_else_stmt(this_01,psVar11);
            }
            local_38 = (((pointer)auVar9)->first).
                       super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::
            _Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<kratos::IfStmt*>
                      ((_Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_38);
          }
        }
        lVar8 = 0x20;
        for (uVar10 = 1; auVar9 = local_60,
            uVar10 < (ulong)((long)stmts.
                                   super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)local_60 >> 5);
            uVar10 = uVar10 + 1) {
          stmts.
          super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)
                ((long)&(((shared_ptr<kratos::IfStmt> *)local_60)->
                        super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                lVar8);
          iVar6 = std::
                  _Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find((_Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (key_type *)this);
          this_02 = mapping._M_h._M_single_bucket;
          if (iVar6.super__Node_iterator_base<kratos::IfStmt_*,_false>._M_cur == (__node_type *)0x0)
          {
            __r = (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(((shared_ptr<kratos::IfStmt> *)auVar9)->
                          super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                  lVar8);
            std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<kratos::IfStmt,void>
                      ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this,__r);
            IfStmt::add_else_stmt((IfStmt *)this_02,(shared_ptr<kratos::Stmt> *)this);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&const_value);
            stmts.
            super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__r->_M_ptr;
            std::
            _Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<kratos::IfStmt*>
                      ((_Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,this);
          }
          lVar8 = lVar8 + 0x20;
        }
        std::
        _Hashtable<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&merged_if._M_h._M_single_bucket);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&top_if);
      }
      std::
      vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
      ::~vector((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                 *)local_60);
    }
    this_00 = &merged_if._M_h._M_single_bucket;
    for (puVar12 = (undefined8 *)merged_if._M_h._M_bucket_count; puVar12 != (undefined8 *)0x0;
        puVar12 = (undefined8 *)*puVar12) {
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
                 (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)(puVar12[1] + 0x68));
      (*(block->super_Stmt).super_IRNode._vptr_IRNode[10])(block,this_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mapping);
    }
    std::
    _Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>,_std::_Select1st<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>,_std::_Select1st<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                 *)local_128);
  }
  return;
}

Assistant:

void static transform_block(StmtBlock* block) {
        // only run marked ones
        if (!block->has_attribute("merge_if_block")) return;
        std::map<Var*, std::vector<IfStmtType>> result;
        get_targeted_if(block, result);
        std::unordered_set<IfStmt*> merged_if;
        for (auto const& iter : result) {
            auto stmts = iter.second;
            if (stmts.size() > 1) {
                // we have stmts to merge
                auto top_if = stmts[0].first;
                // first pass to merge the if statements with the same constant value
                // build index on the const values
                std::unordered_map<int64_t, IfStmt*> mapping;
                for (const auto& [stmt, const_] : stmts) {
                    auto const_value = const_->value();
                    if (mapping.find(const_value) == mapping.end()) {
                        mapping.emplace(const_value, stmt.get());
                    } else {
                        // merge the current one into the one we already have
                        auto* if_ = mapping.at(const_value);
                        auto const& then = stmt->then_body();
                        for (auto const& st : *then) {
                            if_->add_then_stmt(st);
                        }
                        auto const& else_ = stmt->else_body();
                        for (auto const& st : *else_) {
                            if_->add_else_stmt(st);
                        }
                        merged_if.emplace(stmt.get());
                    }
                }

                // second pass to nest the if statement
                for (uint64_t i = 1; i < stmts.size(); i++) {
                    auto const& stmt = stmts[i].first;
                    if (merged_if.find(stmt.get()) != merged_if.end()) {
                        continue;
                    }
                    // put the one in the top if
                    top_if->add_else_stmt(stmt);
                    merged_if.emplace(stmt.get());
                }
            }
        }
        // remove merged if
        for (auto const& stmt : merged_if) {
            block->remove_stmt(stmt->shared_from_this());
        }
    }